

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_ptr.hpp
# Opt level: O0

void __thiscall
nonstd::vptr::detail::
compressed_ptr<(anonymous_namespace)::InitList,_nonstd::vptr::detail::default_clone<(anonymous_namespace)::InitList>,_std::default_delete<(anonymous_namespace)::InitList>_>
::reset(compressed_ptr<(anonymous_namespace)::InitList,_nonstd::vptr::detail::default_clone<(anonymous_namespace)::InitList>,_std::default_delete<(anonymous_namespace)::InitList>_>
        *this,element_type *v)

{
  cloner_type *this_00;
  InitList *p;
  element_type *v_local;
  compressed_ptr<(anonymous_namespace)::InitList,_nonstd::vptr::detail::default_clone<(anonymous_namespace)::InitList>,_std::default_delete<(anonymous_namespace)::InitList>_>
  *this_local;
  
  this_00 = get_cloner(this);
  p = default_clone<(anonymous_namespace)::InitList>::operator()(this_00,v);
  reset(this,p);
  return;
}

Assistant:

void reset( element_type && v )
    {
        reset( get_cloner()( std::move( v ) ) );
    }